

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O1

void __thiscall
Js::InterpreterStackFrame::
OP_InitGetElemI<Js::OpLayoutT_ElementI<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_ElementI<Js::LayoutSizePolicy<(Js::LayoutSize)0>_> *playout)

{
  Var value;
  Var value_00;
  Var value_01;
  ScriptContext *scriptContext;
  
  value = *(Var *)(this + (ulong)playout->Instance * 8 + 0x160);
  ValidateRegValue(this,value,false,true);
  value_00 = *(Var *)(this + (ulong)playout->Element * 8 + 0x160);
  ValidateRegValue(this,value_00,false,true);
  value_01 = *(Var *)(this + (ulong)playout->Value * 8 + 0x160);
  ValidateRegValue(this,value_01,false,true);
  scriptContext = FunctionProxy::GetScriptContext(*(FunctionProxy **)(this + 0x88));
  JavascriptOperators::OP_InitElemGetter
            (value,value_00,value_01,scriptContext,PropertyOperation_None);
  return;
}

Assistant:

void InterpreterStackFrame::OP_InitGetElemI(const unaligned T * playout)
    {
        JavascriptOperators::OP_InitElemGetter(
            GetReg(playout->Instance),
            GetReg(playout->Element),
            GetReg(playout->Value),
            m_functionBody->GetScriptContext()
        );
    }